

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::initPrograms
          (PushConstantComputeTest *this,SourceCollections *sourceCollections)

{
  ProgramSources *pPVar1;
  ostringstream computeSrc;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  uint local_1c0;
  value_type local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version 450\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"  vec4 elements[];\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"} outData;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(push_constant) uniform Material{\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  vec4 element;\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"} matInst;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"compute","");
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  local_1c0 = 5;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_200,local_1f8 + (long)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar1->sources + local_1c0,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void PushConstantComputeTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream	computeSrc;

	computeSrc << "#version 450\n"
			   << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			   << "layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
			   << "  vec4 elements[];\n"
			   << "} outData;\n"
			   << "layout(push_constant) uniform Material{\n"
			   << "  vec4 element;\n"
			   << "} matInst;\n"
			   << "void main (void)\n"
			   << "{\n"
			   << "  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
			   << "}\n";

	sourceCollections.glslSources.add("compute") << glu::ComputeSource(computeSrc.str());
}